

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Signal_PDU::~Signal_PDU(Signal_PDU *this)

{
  ~Signal_PDU(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

Signal_PDU::~Signal_PDU()
{
    m_vData.clear();
}